

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_idtx_avx2
               (int32_t *input,uint8_t *output,int stride,TX_SIZE tx_size,int32_t eob)

{
  int col;
  int row;
  byte in_CL;
  int j;
  int i;
  __m256i buf [32];
  int rect_type;
  int input_stride;
  int row_max;
  int col_max;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int in_stack_fffffffffffffb68;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  __m256i *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffccc;
  uint8_t *in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  int32_t *in_stack_fffffffffffffd48;
  __m256i *in_stack_fffffffffffffd50;
  __m256i *in_stack_fffffffffffffd58;
  __m256i *in_stack_fffffffffffffd60;
  
  get_txw_idx(in_CL);
  get_txh_idx(in_CL);
  col = tx_size_wide[in_CL];
  row = tx_size_high[in_CL];
  local_48c = col;
  if (0x20 < col) {
    local_48c = 0x20;
  }
  local_490 = row;
  if (0x20 < row) {
    local_490 = 0x20;
  }
  get_rect_tx_log_ratio(col,row);
  for (local_484 = 0; local_484 < local_48c >> 4; local_484 = local_484 + 1) {
    for (local_488 = 0; local_488 < local_490 >> 4; local_488 = local_488 + 1) {
      iidentity_row_16xn_avx2
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38,
                 in_stack_fffffffffffffb68);
      transpose_16bit_16x16_avx2(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      iidentity_col_16xn_avx2
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
    }
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_idtx_avx2(const int32_t *input,
                                                  uint8_t *output, int stride,
                                                  TX_SIZE tx_size,
                                                  int32_t eob) {
  (void)eob;
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int col_max = AOMMIN(32, txfm_size_col);
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  __m256i buf[32];

  for (int i = 0; i < (col_max >> 4); ++i) {
    for (int j = 0; j < (row_max >> 4); j++) {
      iidentity_row_16xn_avx2(buf, input + j * 16 + i * 16 * input_stride,
                              row_max, shift[0], 16, txw_idx, rect_type);
      transpose_16bit_16x16_avx2(buf, buf);
      iidentity_col_16xn_avx2(output + i * 16 + j * 16 * stride, stride, buf,
                              shift[1], 16, txh_idx);
    }
  }
}